

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::EntryMap(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  CallInfo CVar2;
  code *pcVar3;
  RecyclableObject *pRVar4;
  RecyclableObject *pRVar5;
  bool bVar6;
  bool bVar7;
  uint32 length_00;
  undefined4 *puVar8;
  Var pvVar9;
  uint64 length_01;
  int in_stack_00000010;
  undefined1 local_b8 [8];
  AutoTagNativeLibraryEntry __tag;
  ArgumentReader args;
  CallInfo callInfo_local;
  JsReentLock jsReentLock;
  BigIndex length;
  RecyclableObject *local_40;
  RecyclableObject *obj;
  JavascriptArray *pArr;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x257d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar6) goto LAB_00a50a2a;
    *puVar8 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&__tag.entry.next,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  CVar2 = (CallInfo)pSVar1->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  bVar6 = *(bool *)((long)CVar2 + 0x108);
  *(bool *)((long)CVar2 + 0x108) = true;
  callInfo_local = CVar2;
  jsReentLock.m_arrayObject2._0_1_ = bVar6;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_b8,function,(CallInfo)args.super_Arguments.Values,
             L"Array.prototype.map",&stack0x00000000);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2584,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar7) goto LAB_00a50a2a;
    *puVar8 = 0;
  }
  if (((uint)__tag.entry.next & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Array.prototype.map");
  }
  BigIndex::BigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,0);
  obj = (RecyclableObject *)0x0;
  local_40 = (RecyclableObject *)0x0;
  *(bool *)((long)CVar2 + 0x108) = bVar6;
  pvVar9 = Arguments::operator[]((Arguments *)&__tag.entry.next,0);
  TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
            (pvVar9,pSVar1,L"Array.prototype.map",(JavascriptArray **)&obj,&local_40,
             (BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
  JsReentLock::MutateArrayObject((JsReentLock *)&callInfo_local);
  pRVar5 = obj;
  pRVar4 = local_40;
  *(undefined1 *)((long)callInfo_local + 0x108) = 1;
  if (jsReentLock._24_4_ == -1) {
    if ((obj != (RecyclableObject *)0x0) && (length._0_8_ != 0xffffffff)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2595,"(pArr == nullptr || length.IsUint32Max())",
                                  "pArr == nullptr || length.IsUint32Max()");
      if (!bVar6) {
LAB_00a50a2a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    pRVar5 = obj;
    pRVar4 = local_40;
    *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    length_01 = BigIndex::GetBigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
    pvVar9 = MapHelper<unsigned_long>
                       ((JavascriptArray *)pRVar5,(TypedArrayBase *)0x0,pRVar4,length_01,
                        (Arguments *)&__tag.entry.next,pSVar1);
  }
  else {
    *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    length_00 = BigIndex::GetSmallIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
    pvVar9 = MapHelper<unsigned_int>
                       ((JavascriptArray *)pRVar5,(TypedArrayBase *)0x0,pRVar4,length_00,
                        (Arguments *)&__tag.entry.next,pSVar1);
  }
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_b8);
  *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar9;
}

Assistant:

Var JavascriptArray::EntryMap(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Array.prototype.map"));

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Array_Prototype_map);

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.map"));
        }

        BigIndex length;
        JavascriptArray* pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.map"), &pArr, &obj, &length));

        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapHelper(pArr, nullptr, obj, length.GetSmallIndex(), args, scriptContext));
        }
        Assert(pArr == nullptr || length.IsUint32Max()); // if pArr is not null lets make sure length is safe to cast, which will only happen if length is a uint32max
        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapHelper(pArr, nullptr, obj, length.GetBigIndex(), args, scriptContext));
    }